

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O3

void greatest_get_report(greatest_report_t *report)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  uVar2 = greatest_info._64_8_;
  if (report != (greatest_report_t *)0x0) {
    uVar1 = greatest_info.failed;
    report->passed = greatest_info.passed;
    uVar3 = greatest_info._64_8_;
    report->failed = uVar1;
    greatest_info.skipped = (uint)uVar2;
    greatest_info.assertions = SUB84(uVar2,4);
    uVar1 = greatest_info.assertions;
    report->skipped = greatest_info.skipped;
    greatest_info._64_8_ = uVar3;
    report->assertions = uVar1;
  }
  return;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(weird_network);
    RUN_TEST(weird_network2);
    RUN_TEST(weird_network3);
    RUN_TEST(CLRS_network);
    RUN_TEST(non_trivial_network1);
    RUN_TEST(non_trivial_network2);
    RUN_TEST(non_trivial_network3);
    RUN_TEST(no_path_flow);
    RUN_TEST(single_path_flow);
    RUN_TEST(two_path_flow);
    RUN_TEST(random_networks);

    GREATEST_MAIN_END(); /* display results */
}